

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 MemObjStringValue(SyBlob *pOut,jx9_value *pObj)

{
  uint uVar1;
  sxu32 sVar2;
  sxi32 extraout_EAX;
  sxi32 sVar3;
  jx9_real jVar4;
  char *pcVar5;
  sxu32 sStack_10;
  
  uVar1 = pObj->iFlags;
  if ((uVar1 & 4) != 0) {
    sVar2 = SyBlobFormat(pOut,"%.15g",(pObj->x).rVal);
    return sVar2;
  }
  if ((uVar1 & 2) == 0) {
    if ((uVar1 & 8) != 0) {
      if ((pObj->x).iVal == 0) {
        pcVar5 = "false";
        sStack_10 = 5;
      }
      else {
        pcVar5 = "true";
        sStack_10 = 4;
      }
      sVar3 = SyBlobAppend(pOut,pcVar5,sStack_10);
      return sVar3;
    }
    if ((uVar1 & 0x40) != 0) {
      jx9JsonSerialize(pObj,pOut);
      jx9HashmapUnref((jx9_hashmap *)(pObj->x).pOther);
      return extraout_EAX;
    }
    if ((uVar1 >> 8 & 1) == 0) {
      return (sxi32)pOut;
    }
    jVar4 = (pObj->x).rVal;
    pcVar5 = "ResourceID_%#x";
  }
  else {
    jVar4 = (pObj->x).rVal;
    pcVar5 = "%qd";
  }
  sVar2 = SyBlobFormat(pOut,pcVar5,jVar4);
  return sVar2;
}

Assistant:

static sxi32 MemObjStringValue(SyBlob *pOut,jx9_value *pObj)
{
	if( pObj->iFlags & MEMOBJ_REAL ){
		SyBlobFormat(&(*pOut), "%.15g", pObj->x.rVal);
	}else if( pObj->iFlags & MEMOBJ_INT ){
		SyBlobFormat(&(*pOut), "%qd", pObj->x.iVal);
		/* %qd (BSD quad) is equivalent to %lld in the libc printf */
	}else if( pObj->iFlags & MEMOBJ_BOOL ){
		if( pObj->x.iVal ){
			SyBlobAppend(&(*pOut),"true", sizeof("true")-1);
		}else{
			SyBlobAppend(&(*pOut),"false", sizeof("false")-1);
		}
	}else if( pObj->iFlags & MEMOBJ_HASHMAP ){
		/* Serialize JSON object or array */
		jx9JsonSerialize(pObj,pOut);
		jx9HashmapUnref((jx9_hashmap *)pObj->x.pOther);
	}else if(pObj->iFlags & MEMOBJ_RES ){
		SyBlobFormat(&(*pOut), "ResourceID_%#x", pObj->x.pOther);
	}
	return SXRET_OK;
}